

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_executor_group.cpp
# Opt level: O0

void __thiscall let::EventExecutor::stop(EventExecutor *this)

{
  pointer this_00;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock_guard;
  EventExecutor *this_local;
  
  lock_guard._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->mutex_);
  this->is_running_ = false;
  this_00 = std::unique_ptr<let::EventLoop,_std::default_delete<let::EventLoop>_>::operator->
                      (&this->event_loop_);
  EventLoop::stop(this_00);
  std::thread::join();
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void EventExecutor::stop()
{
    std::lock_guard<std::mutex> lock_guard(mutex_);
    is_running_ = false;
    event_loop_->stop();
    thread_.join();
}